

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O0

void __thiscall DiyFp::NormalizedBoundaries(DiyFp *this,DiyFp *minus,DiyFp *plus)

{
  DiyFp DVar1;
  undefined1 local_60 [8];
  DiyFp mi;
  DiyFp local_40;
  uint64_t local_30;
  DiyFp pl;
  DiyFp *plus_local;
  DiyFp *minus_local;
  DiyFp *this_local;
  
  pl._8_8_ = plus;
  DiyFp(&local_40,this->f * 2 + 1,this->e + -1);
  DVar1 = NormalizeBoundary(&local_40);
  mi._8_8_ = DVar1.f;
  pl.f._0_4_ = DVar1.e;
  local_30 = mi._8_8_;
  if (this->f == 0x10000000000000) {
    DiyFp((DiyFp *)local_60,this->f * 4 - 1,this->e + -2);
  }
  else {
    DiyFp((DiyFp *)local_60,this->f * 2 - 1,this->e + -1);
  }
  *(uint64_t *)pl._8_8_ = local_30;
  *(int *)(pl._8_8_ + 8) = (int)pl.f;
  minus->f = (long)local_60 << ((char)mi.f - (char)(int)pl.f & 0x3fU);
  minus->e = (int)pl.f;
  return;
}

Assistant:

void NormalizedBoundaries(DiyFp* minus, DiyFp* plus) const {
		DiyFp pl = DiyFp((f << 1) + 1, e - 1).NormalizeBoundary();
		DiyFp mi = (f == kDpHiddenBit) ? DiyFp((f << 2) - 1, e - 2) : DiyFp((f << 1) - 1, e - 1);
		mi.f <<= mi.e - pl.e;
		mi.e = pl.e;
		*plus = pl;
		*minus = mi;
	}